

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

bool __thiscall tsip::start_self_survey(tsip *this)

{
  _command_packet _cmd;
  bool bVar1;
  long in_RDI;
  tsip *in_stack_00000070;
  undefined1 in_stack_00000080 [32];
  bool rc;
  undefined1 in_stack_000000a8 [28];
  undefined1 local_50 [80];
  
  *(undefined1 *)(in_RDI + 0x578) = 0x8e;
  *(undefined1 *)(in_RDI + 0x579) = 0xa6;
  *(undefined1 *)(in_RDI + 0x57a) = 0;
  *(undefined1 *)(in_RDI + 0x5b8) = 3;
  memcpy(local_50,(void *)(in_RDI + 0x578),0x44);
  _cmd._32_8_ = this;
  _cmd._0_32_ = in_stack_00000080;
  _cmd._40_28_ = in_stack_000000a8;
  bVar1 = send_request_msg(in_stack_00000070,_cmd);
  return bVar1;
}

Assistant:

bool tsip::start_self_survey() {
	bool rc;

	//build 8E-A6 request - start self survey
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = COMMAND_SELF_SURVEY;
	m_command.extended.data[0] = 0;
	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);
	return rc;
}